

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O0

void __thiscall helics::zeromq::ZmqComms::closeReceiver(ZmqComms *this)

{
  bool bVar1;
  undefined1 uVar2;
  ConnectionStatus CVar3;
  context_t *pcVar4;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int in_R8D;
  ActionMessage cmd_1;
  socket_t pushSocket;
  shared_ptr<ZmqContextManager> ctx;
  ActionMessage cmd;
  char *in_stack_fffffffffffffd68;
  ActionMessage *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  action_t aVar5;
  context_t *context_;
  ActionMessage *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  string *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  ActionMessage *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd8;
  undefined1 local_188 [39];
  undefined1 local_161 [89];
  context_t local_108 [8];
  undefined4 local_c4;
  ActionMessage local_c0;
  
  aVar5 = (action_t)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  CVar3 = CommsInterface::getTxStatus((CommsInterface *)0x4c01c1);
  if (CVar3 == STARTUP || CVar3 == CONNECTED) {
    ActionMessage::ActionMessage(&local_c0,aVar5);
    local_c0.messageID = 0x16570bf;
    local_c4 = 0xffffffff;
    CommsInterface::transmit
              ((CommsInterface *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               (route_id)(BaseType)((ulong)in_stack_fffffffffffffd80 >> 0x20),
               in_stack_fffffffffffffd70);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffd70);
  }
  else {
    bVar1 = std::atomic::operator_cast_to_bool
                      ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78)
                      );
    if (!bVar1) {
      context_ = local_108;
      std::__cxx11::string::string(in_stack_fffffffffffffd80);
      ZmqContextManager::getContextPointer(in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd70);
      std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x4c02a0);
      pcVar4 = ZmqContextManager::getBaseContext((ZmqContextManager *)0x4c02a8);
      zmq::socket_t::socket_t
                ((socket_t *)in_stack_fffffffffffffd90,context_,(int)((ulong)pcVar4 >> 0x20));
      aVar5 = (action_t)((ulong)context_ >> 0x20);
      local_161[0x45] = 200;
      local_161[0x46] = 0;
      local_161[0x47] = 0;
      local_161[0x48] = 0;
      zmq::detail::socket_base::setsockopt<int>
                ((socket_base *)in_stack_fffffffffffffd70,
                 (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(int *)0x4c02ed);
      uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      if ((bool)uVar2) {
        in_stack_fffffffffffffd70 = (ActionMessage *)local_161;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0))
        ;
        std::__atomic_base::operator_cast_to_int
                  ((__atomic_base<int> *)CONCAT17(uVar2,in_stack_fffffffffffffd78));
        gmlc::networking::makePortAddress(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
        zmq::detail::socket_base::connect
                  ((socket_base *)(local_161 + 0x49),(int)local_161 + 0x21,__addr,in_ECX);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd70);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd70);
        std::allocator<char>::~allocator((allocator<char> *)local_161);
      }
      else {
        std::__atomic_base::operator_cast_to_int
                  ((__atomic_base<int> *)CONCAT17(uVar2,in_stack_fffffffffffffd78));
        gmlc::networking::makePortAddress(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
        zmq::detail::socket_base::connect
                  ((socket_base *)(local_161 + 0x49),(int)local_188,__addr_00,in_ECX);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd70);
      }
      ActionMessage::ActionMessage(in_stack_fffffffffffffd90,aVar5);
      ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffffdc8);
      zmq::detail::socket_base::send
                ((socket_base *)(local_161 + 0x49),(int)&stack0xfffffffffffffda0,(void *)0x0,
                 CONCAT44(in_register_0000000c,in_ECX),in_R8D);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd70);
      ActionMessage::~ActionMessage(in_stack_fffffffffffffd70);
      zmq::socket_t::~socket_t((socket_t *)0x4c0558);
      std::shared_ptr<ZmqContextManager>::~shared_ptr((shared_ptr<ZmqContextManager> *)0x4c0565);
    }
  }
  return;
}

Assistant:

void ZmqComms::closeReceiver()
{
    switch (getTxStatus()) {
        case ConnectionStatus::STARTUP:
        case ConnectionStatus::CONNECTED: {
            ActionMessage cmd(CMD_PROTOCOL);
            cmd.messageID = CLOSE_RECEIVER;
            transmit(control_route, cmd);
        }

        break;
        default:
            if (!disconnecting) {
                // try connecting with the receivers push socket
                auto ctx = ZmqContextManager::getContextPointer();
                zmq::socket_t pushSocket(ctx->getBaseContext(), ZMQ_PUSH);
                pushSocket.setsockopt(ZMQ_LINGER, 200);
                if (localTargetAddress == "tcp://*") {
                    pushSocket.connect(makePortAddress("tcp://127.0.0.1", PortNumber));
                } else {
                    pushSocket.connect(makePortAddress(localTargetAddress, PortNumber));
                }

                ActionMessage cmd(CMD_PROTOCOL);
                cmd.messageID = CLOSE_RECEIVER;
                pushSocket.send(cmd.to_string());
            }
            break;
    }
}